

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O2

void __thiscall
pbrt::MLTSampler::StartPixelSample(MLTSampler *this,Point2i *p,int sampleIndex,int dim)

{
  RNG::SetSequence(&this->rng,
                   (long)(p->super_Tuple2<pbrt::Point2,_int>).y * 0x10000 +
                   (long)(p->super_Tuple2<pbrt::Point2,_int>).x);
  RNG::Advance(&this->rng,(long)(dim * 0x2000 + sampleIndex * 0x10000));
  return;
}

Assistant:

PBRT_CPU_GPU
    void StartPixelSample(const Point2i &p, int sampleIndex, int dim) {
        rng.SetSequence(p.x + p.y * 65536);
        rng.Advance(sampleIndex * 65536 + dim * 8192);
    }